

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::setEigenDecomposition
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  int j;
  ulong uVar10;
  int iVar11;
  
  uVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar4 = (ulong)uVar1;
  if (((this->super_EigenDecomposition<float,_1>).kFlags & 0x100000) == 0) {
    if (0 < (int)uVar1) {
      pfVar2 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
      uVar8 = 0;
      lVar6 = 0;
      do {
        pfVar2[uVar8] = (float)inEigenValues[uVar8];
        pfVar3 = this->gCMatrices[eigenIndex];
        uVar10 = 0;
        pdVar5 = inInverseEigenVectors;
        do {
          iVar11 = (int)lVar6;
          uVar7 = 0;
          do {
            pfVar3[(long)iVar11 + uVar7] = (float)(inEigenVectors[uVar7] * pdVar5[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
          uVar10 = uVar10 + 1;
          lVar6 = (long)iVar11 + uVar7;
          pdVar5 = pdVar5 + uVar4;
        } while (uVar10 != uVar4);
        uVar8 = uVar8 + 1;
        lVar6 = (long)iVar11 + uVar7;
        inEigenVectors = inEigenVectors + uVar4;
      } while (uVar8 != uVar4);
    }
  }
  else if (0 < (int)uVar1) {
    pfVar2 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
    uVar8 = 0;
    lVar6 = 0;
    do {
      pfVar2[uVar8] = (float)inEigenValues[uVar8];
      pfVar3 = this->gCMatrices[eigenIndex];
      uVar10 = 0;
      pdVar5 = inInverseEigenVectors;
      do {
        iVar11 = (int)lVar6;
        uVar7 = 0;
        pdVar9 = pdVar5;
        do {
          pfVar3[(long)iVar11 + uVar7] = (float)(inEigenVectors[uVar7] * *pdVar9);
          uVar7 = uVar7 + 1;
          pdVar9 = pdVar9 + uVar4;
        } while (uVar4 != uVar7);
        uVar10 = uVar10 + 1;
        lVar6 = (long)iVar11 + uVar7;
        pdVar5 = pdVar5 + 1;
      } while (uVar10 != uVar4);
      uVar8 = uVar8 + 1;
      lVar6 = (long)iVar11 + uVar7;
      inEigenVectors = inEigenVectors + uVar4;
    } while (uVar8 != uVar4);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										           const double* inEigenVectors,
                                                   const double* inInverseEigenVectors,
                                                   const double* inEigenValues) {

    if (kFlags & BEAGLE_FLAG_INVEVEC_STANDARD) {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                            * inInverseEigenVectors[(k * kStateCount) + j];
                    l++;
                }
            }
        }
    } else {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                    * inInverseEigenVectors[k + (j*kStateCount)];
                    l++;
                }
            }
        }
    }

}